

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostInfo_p.cpp
# Opt level: O1

HostInfo *
BamTools::Internal::HostInfo::Lookup(HostInfo *__return_storage_ptr__,string *hostname,string *port)

{
  string *psVar1;
  _Rb_tree_header *__last;
  uint uVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  NetworkProtocol NVar6;
  uint32_t uVar7;
  size_t sVar8;
  socklen_t __salen;
  sockaddr *__sa;
  addrinfo *paVar9;
  IPv6Address IVar10;
  addrinfo *res;
  HostAddress address;
  set<BamTools::Internal::HostAddress,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
  uniqueAddresses;
  char serv [32];
  char hbuf [1025];
  undefined1 local_530 [32];
  string *local_510;
  sockaddr local_508;
  HostAddress local_4f8;
  _Rb_tree<BamTools::Internal::HostAddress,_BamTools::Internal::HostAddress,_std::_Identity<BamTools::Internal::HostAddress>,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
  local_4b8;
  sockaddr local_488;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  addrinfo local_468;
  undefined1 local_438 [24];
  _Alloc_hider local_420;
  char local_410 [992];
  
  (__return_storage_ptr__->m_hostName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_hostName).field_2;
  (__return_storage_ptr__->m_hostName)._M_string_length = 0;
  (__return_storage_ptr__->m_hostName).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->m_addresses).
  super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_addresses).
  super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_addresses).
           super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->m_addresses).
           super__Vector_base<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->m_errorString)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorString).field_2;
  (__return_storage_ptr__->m_errorString)._M_string_length = 0;
  (__return_storage_ptr__->m_errorString).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __last = &local_4b8._M_impl.super__Rb_tree_header;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  local_4b8._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  HostAddress::HostAddress(&local_4f8);
  HostAddress::SetAddress(&local_4f8,hostname);
  bVar4 = HostAddress::HasIPAddress(&local_4f8);
  if (!bVar4) {
    local_468.ai_flags = 0;
    local_468.ai_family = 0;
    local_468.ai_canonname = (char *)0x0;
    local_468.ai_next = (addrinfo *)0x0;
    local_468.ai_addrlen = 0;
    local_468._20_4_ = 0;
    local_468.ai_addr = (sockaddr *)0x0;
    local_468.ai_socktype = 1;
    local_468.ai_protocol = 6;
    iVar5 = getaddrinfo((hostname->_M_dataplus)._M_p,(port->_M_dataplus)._M_p,&local_468,
                        (addrinfo **)local_530);
    psVar1 = &__return_storage_ptr__->m_errorString;
    if ((iVar5 + 5U < 2) || (iVar5 == -2)) {
      __return_storage_ptr__->m_error = HostNotFound;
      local_438._0_8_ = local_438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"HostInfo: host not found","");
      std::__cxx11::string::_M_assign((string *)psVar1);
LAB_0016705d:
      if ((pointer)local_438._0_8_ != (pointer)(local_438 + 0x10)) {
        operator_delete((void *)local_438._0_8_);
      }
    }
    else {
      if (iVar5 != 0) {
        __return_storage_ptr__->m_error = UnknownError;
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"HostInfo: unknown error encountered","");
        std::__cxx11::string::_M_assign((string *)psVar1);
        goto LAB_0016705d;
      }
      local_510 = (string *)psVar1;
      if ((addrinfo *)local_530._0_8_ != (addrinfo *)0x0) {
        paVar9 = (addrinfo *)local_530._0_8_;
        do {
          if (paVar9->ai_family == 10) {
            HostAddress::HostAddress
                      ((HostAddress *)local_438,(uint8_t *)(paVar9->ai_addr->sa_data + 6));
            std::
            _Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
            ::_M_insert_unique<BamTools::Internal::HostAddress_const&>
                      ((_Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
                        *)&local_4b8,(HostAddress *)local_438);
LAB_00166e0c:
            if (local_420._M_p != local_410) {
              operator_delete(local_420._M_p);
            }
          }
          else if (paVar9->ai_family == 2) {
            uVar2 = *(uint *)(paVar9->ai_addr->sa_data + 2);
            HostAddress::HostAddress
                      ((HostAddress *)local_438,
                       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                       uVar2 << 0x18);
            std::
            _Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
            ::_M_insert_unique<BamTools::Internal::HostAddress_const&>
                      ((_Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
                        *)&local_4b8,(HostAddress *)local_438);
            goto LAB_00166e0c;
          }
          paVar9 = paVar9->ai_next;
        } while (paVar9 != (addrinfo *)0x0);
      }
      if (local_4b8._M_impl.super__Rb_tree_header._M_node_count == 0) {
        __return_storage_ptr__->m_error = UnknownError;
        local_438._0_8_ = local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_438,"HostInfo: unknown address types found","");
        std::__cxx11::string::_M_assign(local_510);
        goto LAB_0016705d;
      }
    }
    freeaddrinfo((addrinfo *)local_530._0_8_);
    goto LAB_00167079;
  }
  iVar5 = atoi((port->_M_dataplus)._M_p);
  NVar6 = HostAddress::GetProtocol(&local_4f8);
  if (NVar6 == IPv4Protocol) {
    local_508.sa_data[6] = '\0';
    local_508.sa_data[7] = '\0';
    local_508.sa_data[8] = '\0';
    local_508.sa_data[9] = '\0';
    local_508.sa_data[10] = '\0';
    local_508.sa_data[0xb] = '\0';
    local_508.sa_data[0xc] = '\0';
    local_508.sa_data[0xd] = '\0';
    local_508.sa_family = 2;
    local_508.sa_data[0] = '\0';
    local_508.sa_data[1] = '\0';
    local_508.sa_data[2] = '\0';
    local_508.sa_data[3] = '\0';
    local_508.sa_data[4] = '\0';
    local_508.sa_data[5] = '\0';
    uVar7 = HostAddress::GetIPv4Address(&local_4f8);
    __sa = &local_508;
    local_508.sa_data._2_4_ =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
    __salen = 0x10;
LAB_00166f24:
    *(ushort *)__sa->sa_data = (ushort)iVar5 << 8 | (ushort)iVar5 >> 8;
  }
  else {
    NVar6 = HostAddress::GetProtocol(&local_4f8);
    if (NVar6 == IPv4Protocol) {
      local_488.sa_data[6] = '\0';
      local_488.sa_data[7] = '\0';
      local_488.sa_data[8] = '\0';
      local_488.sa_data[9] = '\0';
      local_488.sa_data[10] = '\0';
      local_488.sa_data[0xb] = '\0';
      local_488.sa_data[0xc] = '\0';
      local_488.sa_data[0xd] = '\0';
      local_478 = 0;
      uStack_474 = 0;
      uStack_470 = 0;
      local_488.sa_family = 10;
      local_488.sa_data[0] = '\0';
      local_488.sa_data[1] = '\0';
      local_488.sa_data[2] = '\0';
      local_488.sa_data[3] = '\0';
      local_488.sa_data[4] = '\0';
      local_488.sa_data[5] = '\0';
      IVar10 = HostAddress::GetIPv6Address(&local_4f8);
      __sa = &local_488;
      local_488.sa_data._6_4_ = IVar10.data._0_4_;
      local_488.sa_data._10_4_ = IVar10.data._4_4_;
      local_478 = IVar10.data._8_4_;
      uStack_474 = IVar10.data._12_4_;
      __salen = 0x1c;
      goto LAB_00166f24;
    }
    __salen = 0;
    __sa = (sockaddr *)0x0;
  }
  if (__sa != (sockaddr *)0x0) {
    iVar5 = getnameinfo(__sa,__salen,local_438,0x401,(char *)&local_468,0x20,0);
    if (iVar5 == 0) {
      local_530._0_8_ = (addrinfo *)(local_530 + 0x10);
      sVar8 = strlen(local_438);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_530,local_438,local_438 + sVar8);
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      if ((addrinfo *)local_530._0_8_ != (addrinfo *)(local_530 + 0x10)) {
        operator_delete((void *)local_530._0_8_);
      }
    }
  }
  paVar9 = (addrinfo *)(local_530 + 0x10);
  pcVar3 = (__return_storage_ptr__->m_hostName)._M_dataplus._M_p;
  local_530._0_8_ = paVar9;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_530,pcVar3,
             pcVar3 + (__return_storage_ptr__->m_hostName)._M_string_length);
  if ((addrinfo *)local_530._0_8_ != paVar9) {
    operator_delete((void *)local_530._0_8_);
  }
  if (local_530._8_8_ == 0) {
    HostAddress::GetIPString_abi_cxx11_((string *)local_530,&local_4f8);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    if ((addrinfo *)local_530._0_8_ != paVar9) {
      operator_delete((void *)local_530._0_8_);
    }
  }
  std::
  _Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
  ::_M_insert_unique<BamTools::Internal::HostAddress_const&>
            ((_Rb_tree<BamTools::Internal::HostAddress,BamTools::Internal::HostAddress,std::_Identity<BamTools::Internal::HostAddress>,std::less<BamTools::Internal::HostAddress>,std::allocator<BamTools::Internal::HostAddress>>
              *)&local_4b8,&local_4f8);
LAB_00167079:
  std::vector<BamTools::Internal::HostAddress,std::allocator<BamTools::Internal::HostAddress>>::
  vector<std::_Rb_tree_const_iterator<BamTools::Internal::HostAddress>,void>
            ((vector<BamTools::Internal::HostAddress,std::allocator<BamTools::Internal::HostAddress>>
              *)local_438,
             (_Rb_tree_const_iterator<BamTools::Internal::HostAddress>)
             local_4b8._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<BamTools::Internal::HostAddress>)__last,
             (allocator_type *)&local_468);
  std::vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>::
  operator=(&__return_storage_ptr__->m_addresses,
            (vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
             *)local_438);
  std::vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>::
  ~vector((vector<BamTools::Internal::HostAddress,_std::allocator<BamTools::Internal::HostAddress>_>
           *)local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.m_ipString._M_dataplus._M_p != &local_4f8.m_ipString.field_2) {
    operator_delete(local_4f8.m_ipString._M_dataplus._M_p);
  }
  std::
  _Rb_tree<BamTools::Internal::HostAddress,_BamTools::Internal::HostAddress,_std::_Identity<BamTools::Internal::HostAddress>,_std::less<BamTools::Internal::HostAddress>,_std::allocator<BamTools::Internal::HostAddress>_>
  ::~_Rb_tree(&local_4b8);
  return __return_storage_ptr__;
}

Assistant:

HostInfo HostInfo::Lookup(const std::string& hostname, const std::string& port)
{

    HostInfo result;
    result.SetHostName(hostname);
    std::set<HostAddress> uniqueAddresses;

#ifdef _WIN32
    WindowsSockInit init;
#endif

    HostAddress address;
    address.SetAddress(hostname);

    // if hostname is an IP string ('0.0.0.0' or IPv6 format)
    // do reverse lookup for host domain name
    //
    // TODO: might just remove this... not sure if proper 'hostname' from IP string is needed
    //
    //       so far, haven't been able to successfully fetch a domain name with reverse DNS
    //       getnameinfo() on test sites just returns original IP string. BUT this is likely a rare
    //       case that client code tries to use an IP string and the connection should work fine
    //       anyway. GetHostName() just won't quite show what I was hoping for. :(
    if (address.HasIPAddress()) {

        const uint16_t portNum = static_cast<uint16_t>(std::atoi(port.c_str()));

        sockaddr_in sa4;
        sockaddr_in6 sa6;
        sockaddr* sa = 0;
        BT_SOCKLEN_T saSize = 0;

        // IPv4
        if (address.GetProtocol() == HostAddress::IPv4Protocol) {
            sa = (sockaddr*)&sa4;
            saSize = sizeof(sa4);
            std::memset(&sa4, 0, sizeof(sa4));
            sa4.sin_family = AF_INET;
            sa4.sin_addr.s_addr = htonl(address.GetIPv4Address());
            sa4.sin_port = htons(portNum);
        }

        // IPv6
        else if (address.GetProtocol() == HostAddress::IPv4Protocol) {
            sa = (sockaddr*)&sa6;
            saSize = sizeof(sa6);
            std::memset(&sa6, 0, sizeof(sa6));
            sa6.sin6_family = AF_INET6;
            std::memcpy(sa6.sin6_addr.s6_addr, address.GetIPv6Address().data,
                        sizeof(sa6.sin6_addr.s6_addr));
            sa6.sin6_port = htons(portNum);
        }

        // unknown (should be unreachable)
        else {
            BT_ASSERT_X(false, "HostInfo::Lookup: unknown network protocol");
        }

        // lookup name for IP
        char hbuf[NI_MAXHOST];
        char serv[NI_MAXSERV];
        if (sa && (getnameinfo(sa, saSize, hbuf, sizeof(hbuf), serv, sizeof(serv), 0) == 0)) {
            result.SetHostName(std::string(hbuf));
        }

        // if no domain name found, just use the original address's IP string
        if (result.HostName().empty()) {
            result.SetHostName(address.GetIPString());
        }

        // store address in HostInfo
        uniqueAddresses.insert(address);
    }

    // otherwise, hostname is a domain name ('www.foo.bar')
    // do 'normal' lookup
    else {

        // setup address lookup 'hints'
        addrinfo hints;
        std::memset(&hints, 0, sizeof(hints));
        hints.ai_family = AF_UNSPEC;      // allow either IPv4 or IPv6
        hints.ai_socktype = SOCK_STREAM;  // for TCP
        hints.ai_protocol = IPPROTO_TCP;

        // fetch addresses for requested hostname/port
        addrinfo* res;
        int status = getaddrinfo(hostname.c_str(), port.c_str(), &hints, &res);

        // if everything OK
        if (status == 0) {

            // iterate over all IP addresses found
            addrinfo* p = res;
            for (; p != NULL; p = p->ai_next) {

                // IPv4
                if (p->ai_family == AF_INET) {
                    sockaddr_in* ipv4 = (sockaddr_in*)p->ai_addr;
                    HostAddress a(ntohl(ipv4->sin_addr.s_addr));
                    uniqueAddresses.insert(a);
                }

                // IPv6
                else if (p->ai_family == AF_INET6) {
                    sockaddr_in6* ipv6 = (sockaddr_in6*)p->ai_addr;
                    HostAddress a(ipv6->sin6_addr.s6_addr);
                    uniqueAddresses.insert(a);
                }
            }

            // if we iterated, but no addresses were stored
            if (uniqueAddresses.empty() && (p == NULL)) {
                result.SetError(HostInfo::UnknownError);
                result.SetErrorString("HostInfo: unknown address types found");
            }
        }

        // handle error cases
        else if (
#ifndef _WIN32
            status == EAI_NONAME || status == EAI_FAIL
#ifdef EAI_NODATA
            || status == EAI_NODATA  // officially deprecated, but just in case we happen to hit it
#endif                               // EAI_NODATA

#else   // _WIN32
            WSAGetLastError() == WSAHOST_NOT_FOUND || WSAGetLastError() == WSANO_DATA ||
            WSAGetLastError() == WSANO_RECOVERY
#endif  // _WIN32
        ) {
            result.SetError(HostInfo::HostNotFound);
            result.SetErrorString("HostInfo: host not found");
        } else {
            result.SetError(HostInfo::UnknownError);
            result.SetErrorString("HostInfo: unknown error encountered");
        }